

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O0

void __thiscall t_py_generator::generate_service_client(t_py_generator *this,t_service *tservice)

{
  bool bVar1;
  uint uVar2;
  t_service *ptVar3;
  ostream *poVar4;
  ulong uVar5;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar6;
  t_struct *ptVar7;
  members_type *this_00;
  string *psVar8;
  char *pcVar9;
  t_type *ptVar10;
  reference pptVar11;
  string local_1318;
  string local_12f8;
  string local_12d8;
  string local_12b8;
  string local_1298 [32];
  string local_1278;
  string local_1258 [32];
  string local_1238;
  string local_1218;
  string *local_11f8;
  string *xname;
  t_field **local_11e8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
  local_11e0;
  const_iterator x_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *xceptions;
  t_struct *xs;
  string local_11a8;
  string local_1188 [32];
  string local_1168;
  string local_1148;
  string local_1128;
  string local_1108;
  string local_10e8;
  string local_10c8 [32];
  string local_10a8;
  string local_1088 [32];
  string local_1068;
  string local_1048 [32];
  string local_1028;
  string local_1008;
  string local_fe8;
  string local_fc8;
  string local_fa8 [32];
  string local_f88;
  string local_f68 [32];
  string local_f48;
  string local_f28 [32];
  string local_f08;
  string local_ee8 [32];
  string local_ec8;
  string local_ea8;
  string local_e88;
  string local_e68;
  string local_e48;
  string local_e28;
  string local_e08;
  allocator local_de1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_de0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc0;
  undefined1 local_da0 [8];
  t_function recv_function;
  t_struct noargs;
  undefined1 local_c18 [8];
  string resultname;
  string local_bd8;
  string local_bb8;
  string local_b98;
  string local_b78;
  string local_b58;
  string local_b38;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_b18
  ;
  t_field **local_b10;
  string local_b08;
  string local_ae8;
  string local_ac8;
  string local_aa8;
  allocator local_a81;
  string local_a80 [8];
  string messageType;
  string argsname;
  string local_a20;
  string local_a00;
  string local_9e0;
  string local_9c0;
  string local_9a0;
  string local_980;
  string local_960;
  string local_940;
  string local_920;
  string local_900;
  string local_8e0;
  string local_8c0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_8a0
  ;
  t_field **local_898;
  byte local_889;
  undefined1 local_888 [7];
  bool first;
  string local_868 [8];
  string funname;
  const_iterator fld_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *arg_struct;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_828;
  t_function **local_820;
  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_818;
  const_iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_7d8;
  string local_7b8;
  string local_798 [32];
  string local_778;
  string local_758;
  string local_738 [32];
  string local_718;
  string local_6f8;
  string local_6d8 [32];
  string local_6b8;
  string local_698 [32];
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598 [32];
  string local_578;
  string local_558 [32];
  string local_538;
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8;
  string local_4b8 [32];
  string local_498;
  string local_478;
  string local_458 [32];
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338 [32];
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  allocator local_71;
  string local_70 [8];
  string extends_client;
  allocator local_39;
  undefined1 local_38 [8];
  string extends;
  t_service *tservice_local;
  t_py_generator *this_local;
  
  extends.field_2._8_8_ = tservice;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  ptVar3 = t_service::get_extends((t_service *)extends.field_2._8_8_);
  if (ptVar3 == (t_service *)0x0) {
    if (((this->gen_zope_interface_ & 1U) != 0) &&
       (((this->gen_newstyle_ & 1U) != 0 || ((this->gen_dynamic_ & 1U) != 0)))) {
      std::__cxx11::string::operator=(local_70,"(object)");
    }
  }
  else {
    ptVar3 = t_service::get_extends((t_service *)extends.field_2._8_8_);
    type_name_abi_cxx11_(&local_98,this,&ptVar3->super_t_type);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    if ((this->gen_zope_interface_ & 1U) == 0) {
      std::operator+(&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                     ".Client, ");
      std::__cxx11::string::operator=(local_70,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
    }
    else {
      std::operator+(&local_d8,"(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
      std::operator+(&local_b8,&local_d8,".Client)");
      std::__cxx11::string::operator=(local_70,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
  }
  poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  if ((this->gen_zope_interface_ & 1U) == 0) {
    poVar4 = std::operator<<((ostream *)&this->f_service_,"class Client(");
    poVar4 = std::operator<<(poVar4,local_70);
    poVar4 = std::operator<<(poVar4,"Iface):");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  else {
    poVar4 = std::operator<<((ostream *)&this->f_service_,"@implementer(Iface)");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"class Client");
    poVar4 = std::operator<<(poVar4,local_70);
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  t_generator::indent_up(&this->super_t_generator);
  generate_python_docstring(this,(ostream *)&this->f_service_,(t_doc *)extends.field_2._8_8_);
  if ((this->gen_twisted_ & 1U) == 0) {
    if ((this->gen_tornado_ & 1U) == 0) {
      t_generator::indent_abi_cxx11_(&local_158,&this->super_t_generator);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_158);
      poVar4 = std::operator<<(poVar4,"def __init__(self, iprot, oprot=None):");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_158);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_138,&this->super_t_generator);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_138);
      poVar4 = std::operator<<(poVar4,
                               "def __init__(self, transport, iprot_factory, oprot_factory=None):");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_138);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_118,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_118);
    poVar4 = std::operator<<(poVar4,"def __init__(self, transport, oprot_factory):");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_118);
  }
  t_generator::indent_up(&this->super_t_generator);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    if ((this->gen_twisted_ & 1U) == 0) {
      if ((this->gen_tornado_ & 1U) == 0) {
        t_generator::indent_abi_cxx11_(&local_3b8,&this->super_t_generator);
        poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_3b8);
        poVar4 = std::operator<<(poVar4,(string *)local_38);
        poVar4 = std::operator<<(poVar4,".Client.__init__(self, iprot, oprot)");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_3b8);
      }
      else {
        t_generator::indent_abi_cxx11_(&local_398,&this->super_t_generator);
        poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_398);
        poVar4 = std::operator<<(poVar4,(string *)local_38);
        poVar4 = std::operator<<(poVar4,
                                 ".Client.__init__(self, transport, iprot_factory, oprot_factory)");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_398);
      }
    }
    else {
      t_generator::indent_abi_cxx11_(&local_378,&this->super_t_generator);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_378);
      poVar4 = std::operator<<(poVar4,(string *)local_38);
      poVar4 = std::operator<<(poVar4,".Client.__init__(self, transport, oprot_factory)");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_378);
    }
  }
  else if ((this->gen_twisted_ & 1U) == 0) {
    if ((this->gen_tornado_ & 1U) == 0) {
      t_generator::indent_abi_cxx11_(&local_2d8,&this->super_t_generator);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_2d8);
      poVar4 = std::operator<<(poVar4,"self._iprot = self._oprot = iprot");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_2f8,&this->super_t_generator);
      poVar4 = std::operator<<(poVar4,(string *)&local_2f8);
      poVar4 = std::operator<<(poVar4,"if oprot is not None:");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_318,&this->super_t_generator);
      poVar4 = std::operator<<(poVar4,(string *)&local_318);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_338);
      poVar4 = std::operator<<(poVar4,local_338);
      poVar4 = std::operator<<(poVar4,"self._oprot = oprot");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_358,&this->super_t_generator);
      poVar4 = std::operator<<(poVar4,(string *)&local_358);
      poVar4 = std::operator<<(poVar4,"self._seqid = 0");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string(local_338);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2d8);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_1f8,&this->super_t_generator);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_1f8);
      poVar4 = std::operator<<(poVar4,"self._transport = transport");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_218,&this->super_t_generator);
      poVar4 = std::operator<<(poVar4,(string *)&local_218);
      poVar4 = std::operator<<(poVar4,"self._iprot_factory = iprot_factory");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_238,&this->super_t_generator);
      poVar4 = std::operator<<(poVar4,(string *)&local_238);
      poVar4 = std::operator<<(poVar4,
                               "self._oprot_factory = (oprot_factory if oprot_factory is not None");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_258,&this->super_t_generator);
      poVar4 = std::operator<<(poVar4,(string *)&local_258);
      poVar4 = std::operator<<(poVar4,"                       else iprot_factory)");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_278,&this->super_t_generator);
      poVar4 = std::operator<<(poVar4,(string *)&local_278);
      poVar4 = std::operator<<(poVar4,"self._seqid = 0");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_298,&this->super_t_generator);
      poVar4 = std::operator<<(poVar4,(string *)&local_298);
      poVar4 = std::operator<<(poVar4,"self._reqs = {}");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_2b8,&this->super_t_generator);
      poVar4 = std::operator<<(poVar4,(string *)&local_2b8);
      poVar4 = std::operator<<(poVar4,
                               "self._transport.io_loop.spawn_callback(self._start_receiving)");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_1f8);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_178,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_178);
    poVar4 = std::operator<<(poVar4,"self._transport = transport");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_198,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_198);
    poVar4 = std::operator<<(poVar4,"self._oprot_factory = oprot_factory");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1b8,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_1b8);
    poVar4 = std::operator<<(poVar4,"self._seqid = 0");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1d8,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_1d8);
    poVar4 = std::operator<<(poVar4,"self._reqs = {}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_178);
  }
  t_generator::indent_down(&this->super_t_generator);
  if (((this->gen_tornado_ & 1U) != 0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) != 0))
  {
    poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_3d8,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_3d8);
    poVar4 = std::operator<<(poVar4,"@gen.engine");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_3f8,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_3f8);
    poVar4 = std::operator<<(poVar4,"def _start_receiving(self):");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_3d8);
    t_generator::indent_up(&this->super_t_generator);
    poVar4 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"while True:");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up(&this->super_t_generator);
    t_generator::indent_abi_cxx11_(&local_418,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_418);
    poVar4 = std::operator<<(poVar4,"try:");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_438,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_438);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_458);
    poVar4 = std::operator<<(poVar4,local_458);
    poVar4 = std::operator<<(poVar4,"frame = yield self._transport.readFrame()");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_478,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_478);
    poVar4 = std::operator<<(poVar4,"except TTransport.TTransportException as e:");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_498,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_498);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_4b8);
    poVar4 = std::operator<<(poVar4,local_4b8);
    poVar4 = std::operator<<(poVar4,"for future in self._reqs.values():");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_4d8,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_4d8);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_4f8);
    poVar4 = std::operator<<(poVar4,local_4f8);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_518);
    poVar4 = std::operator<<(poVar4,local_518);
    poVar4 = std::operator<<(poVar4,"future.set_exception(e)");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_538,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_538);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_558);
    poVar4 = std::operator<<(poVar4,local_558);
    poVar4 = std::operator<<(poVar4,"self._reqs = {}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_578,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_578);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_598);
    poVar4 = std::operator<<(poVar4,local_598);
    poVar4 = std::operator<<(poVar4,"return");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_5b8,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_5b8);
    poVar4 = std::operator<<(poVar4,"tr = TTransport.TMemoryBuffer(frame)");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_5d8,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_5d8);
    poVar4 = std::operator<<(poVar4,"iprot = self._iprot_factory.getProtocol(tr)");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_5f8,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_5f8);
    poVar4 = std::operator<<(poVar4,"(fname, mtype, rseqid) = iprot.readMessageBegin()");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_618,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_618);
    poVar4 = std::operator<<(poVar4,"method = getattr(self, \'recv_\' + fname)");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_638,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_638);
    poVar4 = std::operator<<(poVar4,"future = self._reqs.pop(rseqid, None)");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_658,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_658);
    poVar4 = std::operator<<(poVar4,"if not future:");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_678,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_678);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_698);
    poVar4 = std::operator<<(poVar4,local_698);
    poVar4 = std::operator<<(poVar4,"# future has already been discarded");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_6b8,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_6b8);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_6d8);
    poVar4 = std::operator<<(poVar4,local_6d8);
    poVar4 = std::operator<<(poVar4,"continue");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_6f8,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_6f8);
    poVar4 = std::operator<<(poVar4,"try:");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_718,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_718);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_738);
    poVar4 = std::operator<<(poVar4,local_738);
    poVar4 = std::operator<<(poVar4,"result = method(iprot, mtype, rseqid)");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_758,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_758);
    poVar4 = std::operator<<(poVar4,"except Exception as e:");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_778,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_778);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_798);
    poVar4 = std::operator<<(poVar4,local_798);
    poVar4 = std::operator<<(poVar4,"future.set_exception(e)");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_7b8,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_7b8);
    poVar4 = std::operator<<(poVar4,"else:");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_7d8,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_7d8);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])
              (&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    poVar4 = std::operator<<(poVar4,(string *)
                                    &functions.
                                     super__Vector_base<t_function_*,_std::allocator<t_function_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar4 = std::operator<<(poVar4,"future.set_result(result)");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string
              ((string *)
               &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_7d8);
    std::__cxx11::string::~string((string *)&local_7b8);
    std::__cxx11::string::~string(local_798);
    std::__cxx11::string::~string((string *)&local_778);
    std::__cxx11::string::~string((string *)&local_758);
    std::__cxx11::string::~string(local_738);
    std::__cxx11::string::~string((string *)&local_718);
    std::__cxx11::string::~string((string *)&local_6f8);
    std::__cxx11::string::~string(local_6d8);
    std::__cxx11::string::~string((string *)&local_6b8);
    std::__cxx11::string::~string(local_698);
    std::__cxx11::string::~string((string *)&local_678);
    std::__cxx11::string::~string((string *)&local_658);
    std::__cxx11::string::~string((string *)&local_638);
    std::__cxx11::string::~string((string *)&local_618);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::__cxx11::string::~string((string *)&local_5b8);
    std::__cxx11::string::~string(local_598);
    std::__cxx11::string::~string((string *)&local_578);
    std::__cxx11::string::~string(local_558);
    std::__cxx11::string::~string((string *)&local_538);
    std::__cxx11::string::~string(local_518);
    std::__cxx11::string::~string(local_4f8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string(local_4b8);
    std::__cxx11::string::~string((string *)&local_498);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string(local_458);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_418);
    t_generator::indent_down(&this->super_t_generator);
    t_generator::indent_down(&this->super_t_generator);
  }
  __x = t_service::get_functions((t_service *)extends.field_2._8_8_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  ::__normal_iterator(&local_818);
  local_828._M_current =
       (t_function **)
       std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                 ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  __gnu_cxx::
  __normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>::
  __normal_iterator<t_function**>
            ((__normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>
              *)&local_820,&local_828);
  local_818._M_current = local_820;
  while( true ) {
    arg_struct = (t_struct *)
                 std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                           ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=
                      (&local_818,
                       (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)&arg_struct);
    if (!bVar1) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_818);
    ptVar7 = t_function::get_arglist(*pptVar6);
    this_00 = t_struct::get_members(ptVar7);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                       *)((long)&funname.field_2 + 8));
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_818);
    psVar8 = t_function::get_name_abi_cxx11_(*pptVar6);
    std::__cxx11::string::string(local_868,(string *)psVar8);
    std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"def ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_818);
    function_signature_abi_cxx11_((string *)local_888,this,*pptVar6,false);
    poVar4 = std::operator<<(poVar4,(string *)local_888);
    poVar4 = std::operator<<(poVar4,":");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)local_888);
    t_generator::indent_up(&this->super_t_generator);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_818);
    generate_python_docstring(this,(ostream *)&this->f_service_,*pptVar6);
    if ((this->gen_twisted_ & 1U) == 0) {
      if ((this->gen_tornado_ & 1U) == 0) {
        poVar4 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_service_);
        poVar4 = std::operator<<(poVar4,"self.send_");
        poVar4 = std::operator<<(poVar4,local_868);
        std::operator<<(poVar4,"(");
      }
      else {
        poVar4 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_service_);
        poVar4 = std::operator<<(poVar4,"self._seqid += 1");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  ::operator*(&local_818);
        bVar1 = t_function::is_oneway(*pptVar6);
        if (!bVar1) {
          poVar4 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_service_);
          poVar4 = std::operator<<(poVar4,"future = self._reqs[self._seqid] = concurrent.Future()");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        }
        poVar4 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_service_);
        poVar4 = std::operator<<(poVar4,"self.send_");
        poVar4 = std::operator<<(poVar4,local_868);
        std::operator<<(poVar4,"(");
      }
    }
    else {
      poVar4 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_service_);
      poVar4 = std::operator<<(poVar4,"seqid = self._seqid = self._seqid + 1");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_service_);
      poVar4 = std::operator<<(poVar4,"self._reqs[seqid] = defer.Deferred()");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_service_);
      poVar4 = std::operator<<(poVar4,"d = defer.maybeDeferred(self.send_");
      std::operator<<(poVar4,local_868);
    }
    local_889 = (this->gen_twisted_ & 1U) == 0;
    local_898 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
    funname.field_2._8_8_ = local_898;
    while( true ) {
      local_8a0._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)((long)&funname.field_2 + 8),&local_8a0);
      if (!bVar1) break;
      if ((local_889 & 1) == 0) {
        std::operator<<((ostream *)&this->f_service_,", ");
      }
      else {
        local_889 = 0;
      }
      pptVar11 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)((long)&funname.field_2 + 8));
      psVar8 = t_field::get_name_abi_cxx11_(*pptVar11);
      std::operator<<((ostream *)&this->f_service_,(string *)psVar8);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)((long)&funname.field_2 + 8));
    }
    poVar4 = std::operator<<((ostream *)&this->f_service_,")");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_818);
    bVar1 = t_function::is_oneway(*pptVar6);
    if ((!bVar1) && ((this->gen_twisted_ & 1U) == 0)) {
      if ((this->gen_tornado_ & 1U) == 0) {
        t_generator::indent_abi_cxx11_(&local_8c0,&this->super_t_generator);
        std::operator<<((ostream *)&this->f_service_,(string *)&local_8c0);
        std::__cxx11::string::~string((string *)&local_8c0);
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  ::operator*(&local_818);
        ptVar10 = t_function::get_returntype(*pptVar6);
        uVar2 = (*(ptVar10->super_t_doc)._vptr_t_doc[4])();
        if ((uVar2 & 1) == 0) {
          std::operator<<((ostream *)&this->f_service_,"return ");
        }
        poVar4 = std::operator<<((ostream *)&this->f_service_,"self.recv_");
        poVar4 = std::operator<<(poVar4,local_868);
        poVar4 = std::operator<<(poVar4,"()");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
      else {
        poVar4 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_service_);
        poVar4 = std::operator<<(poVar4,"return future");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
    }
    t_generator::indent_down(&this->super_t_generator);
    if ((this->gen_twisted_ & 1U) != 0) {
      t_generator::indent_up(&this->super_t_generator);
      poVar4 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_service_);
      poVar4 = std::operator<<(poVar4,"d.addCallbacks(");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up(&this->super_t_generator);
      t_generator::indent_abi_cxx11_(&local_8e0,&this->super_t_generator);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_8e0);
      poVar4 = std::operator<<(poVar4,"callback=self.cb_send_");
      poVar4 = std::operator<<(poVar4,local_868);
      poVar4 = std::operator<<(poVar4,",");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_900,&this->super_t_generator);
      poVar4 = std::operator<<(poVar4,(string *)&local_900);
      poVar4 = std::operator<<(poVar4,"callbackArgs=(seqid,),");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_920,&this->super_t_generator);
      poVar4 = std::operator<<(poVar4,(string *)&local_920);
      poVar4 = std::operator<<(poVar4,"errback=self.eb_send_");
      poVar4 = std::operator<<(poVar4,local_868);
      poVar4 = std::operator<<(poVar4,",");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_940,&this->super_t_generator);
      poVar4 = std::operator<<(poVar4,(string *)&local_940);
      poVar4 = std::operator<<(poVar4,"errbackArgs=(seqid,))");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_940);
      std::__cxx11::string::~string((string *)&local_920);
      std::__cxx11::string::~string((string *)&local_900);
      std::__cxx11::string::~string((string *)&local_8e0);
      t_generator::indent_down(&this->super_t_generator);
      poVar4 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_service_);
      poVar4 = std::operator<<(poVar4,"return d");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_down(&this->super_t_generator);
      std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_service_);
      poVar4 = std::operator<<(poVar4,"def cb_send_");
      poVar4 = std::operator<<(poVar4,local_868);
      poVar4 = std::operator<<(poVar4,"(self, _, seqid):");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up(&this->super_t_generator);
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_818);
      bVar1 = t_function::is_oneway(*pptVar6);
      if (bVar1) {
        t_generator::indent_abi_cxx11_(&local_960,&this->super_t_generator);
        poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_960);
        poVar4 = std::operator<<(poVar4,"d = self._reqs.pop(seqid)");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_980,&this->super_t_generator);
        poVar4 = std::operator<<(poVar4,(string *)&local_980);
        poVar4 = std::operator<<(poVar4,"d.callback(None)");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_9a0,&this->super_t_generator);
        poVar4 = std::operator<<(poVar4,(string *)&local_9a0);
        poVar4 = std::operator<<(poVar4,"return d");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_9a0);
        std::__cxx11::string::~string((string *)&local_980);
        std::__cxx11::string::~string((string *)&local_960);
      }
      else {
        t_generator::indent_abi_cxx11_(&local_9c0,&this->super_t_generator);
        poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_9c0);
        poVar4 = std::operator<<(poVar4,"return self._reqs[seqid]");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_9c0);
      }
      t_generator::indent_down(&this->super_t_generator);
      std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_service_);
      poVar4 = std::operator<<(poVar4,"def eb_send_");
      poVar4 = std::operator<<(poVar4,local_868);
      poVar4 = std::operator<<(poVar4,"(self, f, seqid):");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up(&this->super_t_generator);
      t_generator::indent_abi_cxx11_(&local_9e0,&this->super_t_generator);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_9e0);
      poVar4 = std::operator<<(poVar4,"d = self._reqs.pop(seqid)");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_a00,&this->super_t_generator);
      poVar4 = std::operator<<(poVar4,(string *)&local_a00);
      poVar4 = std::operator<<(poVar4,"d.errback(f)");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_a20,&this->super_t_generator);
      poVar4 = std::operator<<(poVar4,(string *)&local_a20);
      poVar4 = std::operator<<(poVar4,"return d");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_a20);
      std::__cxx11::string::~string((string *)&local_a00);
      std::__cxx11::string::~string((string *)&local_9e0);
      t_generator::indent_down(&this->super_t_generator);
    }
    std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"def send_");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_818);
    function_signature_abi_cxx11_((string *)((long)&argsname.field_2 + 8),this,*pptVar6,false);
    poVar4 = std::operator<<(poVar4,(string *)(argsname.field_2._M_local_buf + 8));
    poVar4 = std::operator<<(poVar4,":");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)(argsname.field_2._M_local_buf + 8));
    t_generator::indent_up(&this->super_t_generator);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_818);
    psVar8 = t_function::get_name_abi_cxx11_(*pptVar6);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&messageType.field_2 + 8),psVar8,"_args");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_818);
    bVar1 = t_function::is_oneway(*pptVar6);
    pcVar9 = "TMessageType.CALL";
    if (bVar1) {
      pcVar9 = "TMessageType.ONEWAY";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a80,pcVar9,&local_a81);
    std::allocator<char>::~allocator((allocator<char> *)&local_a81);
    if (((this->gen_twisted_ & 1U) == 0) && ((this->gen_tornado_ & 1U) == 0)) {
      t_generator::indent_abi_cxx11_(&local_ae8,&this->super_t_generator);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_ae8);
      poVar4 = std::operator<<(poVar4,"self._oprot.writeMessageBegin(\'");
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_818);
      psVar8 = t_function::get_name_abi_cxx11_(*pptVar6);
      poVar4 = std::operator<<(poVar4,(string *)psVar8);
      poVar4 = std::operator<<(poVar4,"\', ");
      poVar4 = std::operator<<(poVar4,local_a80);
      poVar4 = std::operator<<(poVar4,", self._seqid)");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_ae8);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_aa8,&this->super_t_generator);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_aa8);
      poVar4 = std::operator<<(poVar4,"oprot = self._oprot_factory.getProtocol(self._transport)");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_ac8,&this->super_t_generator);
      poVar4 = std::operator<<(poVar4,(string *)&local_ac8);
      poVar4 = std::operator<<(poVar4,"oprot.writeMessageBegin(\'");
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_818);
      psVar8 = t_function::get_name_abi_cxx11_(*pptVar6);
      poVar4 = std::operator<<(poVar4,(string *)psVar8);
      poVar4 = std::operator<<(poVar4,"\', ");
      poVar4 = std::operator<<(poVar4,local_a80);
      poVar4 = std::operator<<(poVar4,", self._seqid)");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_ac8);
      std::__cxx11::string::~string((string *)&local_aa8);
    }
    t_generator::indent_abi_cxx11_(&local_b08,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_b08);
    poVar4 = std::operator<<(poVar4,"args = ");
    poVar4 = std::operator<<(poVar4,(string *)(messageType.field_2._M_local_buf + 8));
    poVar4 = std::operator<<(poVar4,"()");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_b08);
    local_b10 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
    funname.field_2._8_8_ = local_b10;
    while( true ) {
      local_b18._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)((long)&funname.field_2 + 8),&local_b18);
      if (!bVar1) break;
      t_generator::indent_abi_cxx11_(&local_b38,&this->super_t_generator);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_b38);
      poVar4 = std::operator<<(poVar4,"args.");
      pptVar11 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)((long)&funname.field_2 + 8));
      psVar8 = t_field::get_name_abi_cxx11_(*pptVar11);
      poVar4 = std::operator<<(poVar4,(string *)psVar8);
      poVar4 = std::operator<<(poVar4," = ");
      pptVar11 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)((long)&funname.field_2 + 8));
      psVar8 = t_field::get_name_abi_cxx11_(*pptVar11);
      poVar4 = std::operator<<(poVar4,(string *)psVar8);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_b38);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)((long)&funname.field_2 + 8));
    }
    if (((this->gen_twisted_ & 1U) == 0) && ((this->gen_tornado_ & 1U) == 0)) {
      t_generator::indent_abi_cxx11_(&local_bb8,&this->super_t_generator);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_bb8);
      poVar4 = std::operator<<(poVar4,"args.write(self._oprot)");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_bd8,&this->super_t_generator);
      poVar4 = std::operator<<(poVar4,(string *)&local_bd8);
      poVar4 = std::operator<<(poVar4,"self._oprot.writeMessageEnd()");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_
                ((string *)((long)&resultname.field_2 + 8),&this->super_t_generator);
      poVar4 = std::operator<<(poVar4,(string *)(resultname.field_2._M_local_buf + 8));
      poVar4 = std::operator<<(poVar4,"self._oprot.trans.flush()");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)(resultname.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_bd8);
      std::__cxx11::string::~string((string *)&local_bb8);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_b58,&this->super_t_generator);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_b58);
      poVar4 = std::operator<<(poVar4,"args.write(oprot)");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_b78,&this->super_t_generator);
      poVar4 = std::operator<<(poVar4,(string *)&local_b78);
      poVar4 = std::operator<<(poVar4,"oprot.writeMessageEnd()");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_b98,&this->super_t_generator);
      poVar4 = std::operator<<(poVar4,(string *)&local_b98);
      poVar4 = std::operator<<(poVar4,"oprot.trans.flush()");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_b98);
      std::__cxx11::string::~string((string *)&local_b78);
      std::__cxx11::string::~string((string *)&local_b58);
    }
    t_generator::indent_down(&this->super_t_generator);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_818);
    bVar1 = t_function::is_oneway(*pptVar6);
    if (!bVar1) {
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_818);
      psVar8 = t_function::get_name_abi_cxx11_(*pptVar6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c18,
                     psVar8,"_result");
      std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
      if (((this->gen_twisted_ & 1U) == 0) && ((this->gen_tornado_ & 1U) == 0)) {
        t_struct::t_struct((t_struct *)&recv_function.own_xceptions_,
                           (this->super_t_generator).program_);
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  ::operator*(&local_818);
        ptVar10 = t_function::get_returntype(*pptVar6);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_de0,"recv_",&local_de1);
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  ::operator*(&local_818);
        psVar8 = t_function::get_name_abi_cxx11_(*pptVar6);
        std::operator+(&local_dc0,&local_de0,psVar8);
        t_function::t_function
                  ((t_function *)local_da0,ptVar10,&local_dc0,
                   (t_struct *)&recv_function.own_xceptions_,false);
        std::__cxx11::string::~string((string *)&local_dc0);
        std::__cxx11::string::~string((string *)&local_de0);
        std::allocator<char>::~allocator((allocator<char> *)&local_de1);
        t_generator::indent_abi_cxx11_(&local_e08,&this->super_t_generator);
        poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_e08);
        poVar4 = std::operator<<(poVar4,"def ");
        function_signature_abi_cxx11_(&local_e28,this,(t_function *)local_da0,false);
        poVar4 = std::operator<<(poVar4,(string *)&local_e28);
        poVar4 = std::operator<<(poVar4,":");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_e28);
        std::__cxx11::string::~string((string *)&local_e08);
        t_function::~t_function((t_function *)local_da0);
        t_struct::~t_struct((t_struct *)&recv_function.own_xceptions_);
      }
      else {
        t_generator::indent_abi_cxx11_((string *)&noargs.xsd_all_,&this->super_t_generator);
        poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&noargs.xsd_all_);
        poVar4 = std::operator<<(poVar4,"def recv_");
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  ::operator*(&local_818);
        psVar8 = t_function::get_name_abi_cxx11_(*pptVar6);
        poVar4 = std::operator<<(poVar4,(string *)psVar8);
        poVar4 = std::operator<<(poVar4,"(self, iprot, mtype, rseqid):");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&noargs.xsd_all_);
      }
      t_generator::indent_up(&this->super_t_generator);
      if ((this->gen_twisted_ & 1U) == 0) {
        if ((this->gen_tornado_ & 1U) == 0) {
          t_generator::indent_abi_cxx11_(&local_e68,&this->super_t_generator);
          poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_e68);
          poVar4 = std::operator<<(poVar4,"iprot = self._iprot");
          poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          t_generator::indent_abi_cxx11_(&local_e88,&this->super_t_generator);
          poVar4 = std::operator<<(poVar4,(string *)&local_e88);
          poVar4 = std::operator<<(poVar4,"(fname, mtype, rseqid) = iprot.readMessageBegin()");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_e88);
          std::__cxx11::string::~string((string *)&local_e68);
        }
      }
      else {
        t_generator::indent_abi_cxx11_(&local_e48,&this->super_t_generator);
        poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_e48);
        poVar4 = std::operator<<(poVar4,"d = self._reqs.pop(rseqid)");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_e48);
      }
      t_generator::indent_abi_cxx11_(&local_ea8,&this->super_t_generator);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_ea8);
      poVar4 = std::operator<<(poVar4,"if mtype == TMessageType.EXCEPTION:");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_ec8,&this->super_t_generator);
      poVar4 = std::operator<<(poVar4,(string *)&local_ec8);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_ee8);
      poVar4 = std::operator<<(poVar4,local_ee8);
      poVar4 = std::operator<<(poVar4,"x = TApplicationException()");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string(local_ee8);
      std::__cxx11::string::~string((string *)&local_ec8);
      std::__cxx11::string::~string((string *)&local_ea8);
      if ((this->gen_twisted_ & 1U) == 0) {
        t_generator::indent_abi_cxx11_(&local_1028,&this->super_t_generator);
        poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_1028);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_1048);
        poVar4 = std::operator<<(poVar4,local_1048);
        poVar4 = std::operator<<(poVar4,"x.read(iprot)");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_1068,&this->super_t_generator);
        poVar4 = std::operator<<(poVar4,(string *)&local_1068);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_1088);
        poVar4 = std::operator<<(poVar4,local_1088);
        poVar4 = std::operator<<(poVar4,"iprot.readMessageEnd()");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_10a8,&this->super_t_generator);
        poVar4 = std::operator<<(poVar4,(string *)&local_10a8);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_10c8);
        poVar4 = std::operator<<(poVar4,local_10c8);
        poVar4 = std::operator<<(poVar4,"raise x");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_10e8,&this->super_t_generator);
        poVar4 = std::operator<<(poVar4,(string *)&local_10e8);
        poVar4 = std::operator<<(poVar4,"result = ");
        poVar4 = std::operator<<(poVar4,(string *)local_c18);
        poVar4 = std::operator<<(poVar4,"()");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_1108,&this->super_t_generator);
        poVar4 = std::operator<<(poVar4,(string *)&local_1108);
        poVar4 = std::operator<<(poVar4,"result.read(iprot)");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_1128,&this->super_t_generator);
        poVar4 = std::operator<<(poVar4,(string *)&local_1128);
        poVar4 = std::operator<<(poVar4,"iprot.readMessageEnd()");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1128);
        std::__cxx11::string::~string((string *)&local_1108);
        std::__cxx11::string::~string((string *)&local_10e8);
        std::__cxx11::string::~string(local_10c8);
        std::__cxx11::string::~string((string *)&local_10a8);
        std::__cxx11::string::~string(local_1088);
        std::__cxx11::string::~string((string *)&local_1068);
        std::__cxx11::string::~string(local_1048);
        std::__cxx11::string::~string((string *)&local_1028);
      }
      else {
        t_generator::indent_abi_cxx11_(&local_f08,&this->super_t_generator);
        poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_f08);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_f28);
        poVar4 = std::operator<<(poVar4,local_f28);
        poVar4 = std::operator<<(poVar4,"x.read(iprot)");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_f48,&this->super_t_generator);
        poVar4 = std::operator<<(poVar4,(string *)&local_f48);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_f68);
        poVar4 = std::operator<<(poVar4,local_f68);
        poVar4 = std::operator<<(poVar4,"iprot.readMessageEnd()");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_f88,&this->super_t_generator);
        poVar4 = std::operator<<(poVar4,(string *)&local_f88);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_fa8);
        poVar4 = std::operator<<(poVar4,local_fa8);
        poVar4 = std::operator<<(poVar4,"return d.errback(x)");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_fc8,&this->super_t_generator);
        poVar4 = std::operator<<(poVar4,(string *)&local_fc8);
        poVar4 = std::operator<<(poVar4,"result = ");
        poVar4 = std::operator<<(poVar4,(string *)local_c18);
        poVar4 = std::operator<<(poVar4,"()");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_fe8,&this->super_t_generator);
        poVar4 = std::operator<<(poVar4,(string *)&local_fe8);
        poVar4 = std::operator<<(poVar4,"result.read(iprot)");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_1008,&this->super_t_generator);
        poVar4 = std::operator<<(poVar4,(string *)&local_1008);
        poVar4 = std::operator<<(poVar4,"iprot.readMessageEnd()");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1008);
        std::__cxx11::string::~string((string *)&local_fe8);
        std::__cxx11::string::~string((string *)&local_fc8);
        std::__cxx11::string::~string(local_fa8);
        std::__cxx11::string::~string((string *)&local_f88);
        std::__cxx11::string::~string(local_f68);
        std::__cxx11::string::~string((string *)&local_f48);
        std::__cxx11::string::~string(local_f28);
        std::__cxx11::string::~string((string *)&local_f08);
      }
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_818);
      ptVar10 = t_function::get_returntype(*pptVar6);
      uVar2 = (*(ptVar10->super_t_doc)._vptr_t_doc[4])();
      if ((uVar2 & 1) == 0) {
        t_generator::indent_abi_cxx11_(&local_1148,&this->super_t_generator);
        poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_1148);
        poVar4 = std::operator<<(poVar4,"if result.success is not None:");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1148);
        if ((this->gen_twisted_ & 1U) == 0) {
          t_generator::indent_abi_cxx11_(&local_11a8,&this->super_t_generator);
          poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_11a8);
          (*(this->super_t_generator)._vptr_t_generator[0x1e])(&xs);
          poVar4 = std::operator<<(poVar4,(string *)&xs);
          poVar4 = std::operator<<(poVar4,"return result.success");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&xs);
          std::__cxx11::string::~string((string *)&local_11a8);
        }
        else {
          t_generator::indent_abi_cxx11_(&local_1168,&this->super_t_generator);
          poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_1168);
          (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_1188);
          poVar4 = std::operator<<(poVar4,local_1188);
          poVar4 = std::operator<<(poVar4,"return d.callback(result.success)");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string(local_1188);
          std::__cxx11::string::~string((string *)&local_1168);
        }
      }
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_818);
      ptVar7 = t_function::get_xceptions(*pptVar6);
      x_iter._M_current = (t_field **)t_struct::get_members(ptVar7);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      __normal_iterator(&local_11e0);
      local_11e8 = (t_field **)
                   std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(x_iter._M_current);
      local_11e0._M_current = local_11e8;
      while( true ) {
        xname = (string *)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                          ((vector<t_field_*,_std::allocator<t_field_*>_> *)x_iter._M_current);
        bVar1 = __gnu_cxx::operator!=
                          (&local_11e0,
                           (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                            *)&xname);
        if (!bVar1) break;
        pptVar11 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_11e0);
        local_11f8 = t_field::get_name_abi_cxx11_(*pptVar11);
        t_generator::indent_abi_cxx11_(&local_1218,&this->super_t_generator);
        poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_1218);
        poVar4 = std::operator<<(poVar4,"if result.");
        poVar4 = std::operator<<(poVar4,(string *)local_11f8);
        poVar4 = std::operator<<(poVar4," is not None:");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1218);
        if ((this->gen_twisted_ & 1U) == 0) {
          t_generator::indent_abi_cxx11_(&local_1278,&this->super_t_generator);
          poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_1278);
          (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_1298);
          poVar4 = std::operator<<(poVar4,local_1298);
          poVar4 = std::operator<<(poVar4,"raise result.");
          poVar4 = std::operator<<(poVar4,(string *)local_11f8);
          poVar4 = std::operator<<(poVar4,"");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string(local_1298);
          std::__cxx11::string::~string((string *)&local_1278);
        }
        else {
          t_generator::indent_abi_cxx11_(&local_1238,&this->super_t_generator);
          poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_1238);
          (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_1258);
          poVar4 = std::operator<<(poVar4,local_1258);
          poVar4 = std::operator<<(poVar4,"return d.errback(result.");
          poVar4 = std::operator<<(poVar4,(string *)local_11f8);
          poVar4 = std::operator<<(poVar4,")");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string(local_1258);
          std::__cxx11::string::~string((string *)&local_1238);
        }
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_11e0);
      }
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_818);
      ptVar10 = t_function::get_returntype(*pptVar6);
      uVar2 = (*(ptVar10->super_t_doc)._vptr_t_doc[4])();
      if ((uVar2 & 1) == 0) {
        if ((this->gen_twisted_ & 1U) == 0) {
          t_generator::indent_abi_cxx11_(&local_1318,&this->super_t_generator);
          poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_1318);
          poVar4 = std::operator<<(poVar4,
                                   "raise TApplicationException(TApplicationException.MISSING_RESULT, \""
                                  );
          pptVar6 = __gnu_cxx::
                    __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                    ::operator*(&local_818);
          psVar8 = t_function::get_name_abi_cxx11_(*pptVar6);
          poVar4 = std::operator<<(poVar4,(string *)psVar8);
          poVar4 = std::operator<<(poVar4," failed: unknown result\")");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_1318);
        }
        else {
          t_generator::indent_abi_cxx11_(&local_12f8,&this->super_t_generator);
          poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_12f8);
          poVar4 = std::operator<<(poVar4,
                                   "return d.errback(TApplicationException(TApplicationException.MISSING_RESULT, \""
                                  );
          pptVar6 = __gnu_cxx::
                    __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                    ::operator*(&local_818);
          psVar8 = t_function::get_name_abi_cxx11_(*pptVar6);
          poVar4 = std::operator<<(poVar4,(string *)psVar8);
          poVar4 = std::operator<<(poVar4," failed: unknown result\"))");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_12f8);
        }
      }
      else if ((this->gen_twisted_ & 1U) == 0) {
        t_generator::indent_abi_cxx11_(&local_12d8,&this->super_t_generator);
        poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_12d8);
        poVar4 = std::operator<<(poVar4,"return");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_12d8);
      }
      else {
        t_generator::indent_abi_cxx11_(&local_12b8,&this->super_t_generator);
        poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_12b8);
        poVar4 = std::operator<<(poVar4,"return d.callback(None)");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_12b8);
      }
      t_generator::indent_down(&this->super_t_generator);
      std::__cxx11::string::~string((string *)local_c18);
    }
    std::__cxx11::string::~string(local_a80);
    std::__cxx11::string::~string((string *)(messageType.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_868);
    __gnu_cxx::
    __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
    ::operator++(&local_818);
  }
  t_generator::indent_down(&this->super_t_generator);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void t_py_generator::generate_service_client(t_service* tservice) {
  string extends = "";
  string extends_client = "";
  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    if (gen_zope_interface_) {
      extends_client = "(" + extends + ".Client)";
    } else {
      extends_client = extends + ".Client, ";
    }
  } else {
    if (gen_zope_interface_ && (gen_newstyle_ || gen_dynamic_)) {
      extends_client = "(object)";
    }
  }

  f_service_ << endl << endl;

  if (gen_zope_interface_) {
    f_service_ << "@implementer(Iface)" << endl
               << "class Client" << extends_client << ":" << endl
               << endl;
  } else {
    f_service_ << "class Client(" << extends_client << "Iface):" << endl;
  }
  indent_up();
  generate_python_docstring(f_service_, tservice);

  // Constructor function
  if (gen_twisted_) {
    f_service_ << indent() << "def __init__(self, transport, oprot_factory):" << endl;
  } else if (gen_tornado_) {
    f_service_ << indent()
               << "def __init__(self, transport, iprot_factory, oprot_factory=None):" << endl;
  } else {
    f_service_ << indent() << "def __init__(self, iprot, oprot=None):" << endl;
  }
  indent_up();
  if (extends.empty()) {
    if (gen_twisted_) {
      f_service_ << indent() << "self._transport = transport" << endl
                 << indent() << "self._oprot_factory = oprot_factory" << endl
                 << indent() << "self._seqid = 0" << endl
                 << indent() << "self._reqs = {}" << endl;
    } else if (gen_tornado_) {
      f_service_ << indent() << "self._transport = transport" << endl
                 << indent() << "self._iprot_factory = iprot_factory" << endl
                 << indent() << "self._oprot_factory = (oprot_factory if oprot_factory is not None"
                 << endl
                 << indent() << "                       else iprot_factory)" << endl
                 << indent() << "self._seqid = 0" << endl
                 << indent() << "self._reqs = {}" << endl
                 << indent() << "self._transport.io_loop.spawn_callback(self._start_receiving)"
                 << endl;
    } else {
      f_service_ << indent() << "self._iprot = self._oprot = iprot" << endl
                 << indent() << "if oprot is not None:" << endl
                 << indent() << indent_str() << "self._oprot = oprot" << endl
                 << indent() << "self._seqid = 0" << endl;
    }
  } else {
    if (gen_twisted_) {
      f_service_ << indent() << extends
                 << ".Client.__init__(self, transport, oprot_factory)" << endl;
    } else if (gen_tornado_) {
      f_service_ << indent() << extends
                 << ".Client.__init__(self, transport, iprot_factory, oprot_factory)" << endl;
    } else {
      f_service_ << indent() << extends << ".Client.__init__(self, iprot, oprot)" << endl;
    }
  }
  indent_down();

  if (gen_tornado_ && extends.empty()) {
    f_service_ << endl <<
      indent() << "@gen.engine" << endl <<
      indent() << "def _start_receiving(self):" << endl;
    indent_up();
    indent(f_service_) << "while True:" << endl;
    indent_up();
    f_service_ << indent() << "try:" << endl
               << indent() << indent_str() << "frame = yield self._transport.readFrame()" << endl
               << indent() << "except TTransport.TTransportException as e:" << endl
               << indent() << indent_str() << "for future in self._reqs.values():" << endl
               << indent() << indent_str() << indent_str() << "future.set_exception(e)" << endl
               << indent() << indent_str() << "self._reqs = {}" << endl
               << indent() << indent_str() << "return" << endl
               << indent() << "tr = TTransport.TMemoryBuffer(frame)" << endl
               << indent() << "iprot = self._iprot_factory.getProtocol(tr)" << endl
               << indent() << "(fname, mtype, rseqid) = iprot.readMessageBegin()" << endl
               << indent() << "method = getattr(self, 'recv_' + fname)" << endl
               << indent() << "future = self._reqs.pop(rseqid, None)" << endl
               << indent() << "if not future:" << endl
               << indent() << indent_str() << "# future has already been discarded" << endl
               << indent() << indent_str() << "continue" << endl
               << indent() << "try:" << endl
               << indent() << indent_str() << "result = method(iprot, mtype, rseqid)" << endl
               << indent() << "except Exception as e:" << endl
               << indent() << indent_str() << "future.set_exception(e)" << endl
               << indent() << "else:" << endl
               << indent() << indent_str() << "future.set_result(result)" << endl;
    indent_down();
    indent_down();
  }

  // Generate client method implementations
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* arg_struct = (*f_iter)->get_arglist();
    const vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator fld_iter;
    string funname = (*f_iter)->get_name();

    f_service_ << endl;
    // Open function
    indent(f_service_) << "def " << function_signature(*f_iter, false) << ":" << endl;
    indent_up();
    generate_python_docstring(f_service_, (*f_iter));
    if (gen_twisted_) {
      indent(f_service_) << "seqid = self._seqid = self._seqid + 1" << endl;
      indent(f_service_) << "self._reqs[seqid] = defer.Deferred()" << endl << endl;
      indent(f_service_) << "d = defer.maybeDeferred(self.send_" << funname;

    } else if (gen_tornado_) {
      indent(f_service_) << "self._seqid += 1" << endl;
      if (!(*f_iter)->is_oneway()) {
        indent(f_service_) << "future = self._reqs[self._seqid] = concurrent.Future()" << endl;
      }
      indent(f_service_) << "self.send_" << funname << "(";

    } else {
      indent(f_service_) << "self.send_" << funname << "(";
    }

    bool first = true;
    if (gen_twisted_) {
      // we need a leading comma if there are args, since it's called as maybeDeferred(funcname,
      // arg)
      first = false;
    }
    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      if (first) {
        first = false;
      } else {
        f_service_ << ", ";
      }
      f_service_ << (*fld_iter)->get_name();
    }

    f_service_ << ")" << endl;

    if (!(*f_iter)->is_oneway()) {
      if (gen_twisted_) {
        // nothing. See the next block.
      } else if (gen_tornado_) {
        indent(f_service_) << "return future" << endl;
      } else {
        f_service_ << indent();
        if (!(*f_iter)->get_returntype()->is_void()) {
          f_service_ << "return ";
        }
        f_service_ << "self.recv_" << funname << "()" << endl;
      }
    }
    indent_down();

    if (gen_twisted_) {
      // This block injects the body of the send_<> method for twisted (and a cb/eb pair)
      indent_up();
      indent(f_service_) << "d.addCallbacks(" << endl;

      indent_up();
      f_service_ << indent() << "callback=self.cb_send_" << funname << "," << endl << indent()
                 << "callbackArgs=(seqid,)," << endl << indent() << "errback=self.eb_send_"
                 << funname << "," << endl << indent() << "errbackArgs=(seqid,))" << endl;
      indent_down();

      indent(f_service_) << "return d" << endl;
      indent_down();
      f_service_ << endl;

      indent(f_service_) << "def cb_send_" << funname << "(self, _, seqid):" << endl;
      indent_up();
      if ((*f_iter)->is_oneway()) {
        // if one-way, fire the deferred & remove it from _reqs
        f_service_ << indent() << "d = self._reqs.pop(seqid)" << endl << indent()
                   << "d.callback(None)" << endl << indent() << "return d" << endl;
      } else {
        f_service_ << indent() << "return self._reqs[seqid]" << endl;
      }
      indent_down();
      f_service_ << endl;

      // add an errback to fail the request if the call to send_<> raised an exception
      indent(f_service_) << "def eb_send_" << funname << "(self, f, seqid):" << endl;
      indent_up();
      f_service_ << indent() << "d = self._reqs.pop(seqid)" << endl << indent() << "d.errback(f)"
                 << endl << indent() << "return d" << endl;
      indent_down();
    }

    f_service_ << endl;
    indent(f_service_) << "def send_" << function_signature(*f_iter, false) << ":" << endl;
    indent_up();

    std::string argsname = (*f_iter)->get_name() + "_args";
    std::string messageType = (*f_iter)->is_oneway() ? "TMessageType.ONEWAY" : "TMessageType.CALL";

    // Serialize the request header
    if (gen_twisted_ || gen_tornado_) {
      f_service_ << indent() << "oprot = self._oprot_factory.getProtocol(self._transport)" << endl
                 << indent() << "oprot.writeMessageBegin('" << (*f_iter)->get_name() << "', "
                 << messageType << ", self._seqid)" << endl;
    } else {
      f_service_ << indent() << "self._oprot.writeMessageBegin('" << (*f_iter)->get_name() << "', "
                 << messageType << ", self._seqid)" << endl;
    }

    f_service_ << indent() << "args = " << argsname << "()" << endl;

    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      f_service_ << indent() << "args." << (*fld_iter)->get_name() << " = "
                 << (*fld_iter)->get_name() << endl;
    }

    // Write to the stream
    if (gen_twisted_ || gen_tornado_) {
      f_service_ << indent() << "args.write(oprot)" << endl << indent() << "oprot.writeMessageEnd()"
                 << endl << indent() << "oprot.trans.flush()" << endl;
    } else {
      f_service_ << indent() << "args.write(self._oprot)" << endl << indent()
                 << "self._oprot.writeMessageEnd()" << endl << indent()
                 << "self._oprot.trans.flush()" << endl;
    }

    indent_down();

    if (!(*f_iter)->is_oneway()) {
      std::string resultname = (*f_iter)->get_name() + "_result";
      // Open function
      f_service_ << endl;
      if (gen_twisted_ || gen_tornado_) {
        f_service_ << indent() << "def recv_" << (*f_iter)->get_name()
                   << "(self, iprot, mtype, rseqid):" << endl;
      } else {
        t_struct noargs(program_);
        t_function recv_function((*f_iter)->get_returntype(),
                                 string("recv_") + (*f_iter)->get_name(),
                                 &noargs);
        f_service_ << indent() << "def " << function_signature(&recv_function) << ":" << endl;
      }
      indent_up();

      // TODO(mcslee): Validate message reply here, seq ids etc.

      if (gen_twisted_) {
        f_service_ << indent() << "d = self._reqs.pop(rseqid)" << endl;
      } else if (gen_tornado_) {
      } else {
        f_service_ << indent() << "iprot = self._iprot" << endl << indent()
                   << "(fname, mtype, rseqid) = iprot.readMessageBegin()" << endl;
      }

      f_service_ << indent() << "if mtype == TMessageType.EXCEPTION:" << endl
                 << indent() << indent_str() << "x = TApplicationException()" << endl;

      if (gen_twisted_) {
        f_service_ << indent() << indent_str() << "x.read(iprot)" << endl << indent()
                   << indent_str() << "iprot.readMessageEnd()" << endl << indent() << indent_str() << "return d.errback(x)"
                   << endl << indent() << "result = " << resultname << "()" << endl << indent()
                   << "result.read(iprot)" << endl << indent() << "iprot.readMessageEnd()" << endl;
      } else {
        f_service_ << indent() << indent_str() << "x.read(iprot)" << endl << indent()
                   << indent_str() << "iprot.readMessageEnd()" << endl << indent() << indent_str() << "raise x" << endl
                   << indent() << "result = " << resultname << "()" << endl << indent()
                   << "result.read(iprot)" << endl << indent() << "iprot.readMessageEnd()" << endl;
      }

      // Careful, only return _result if not a void function
      if (!(*f_iter)->get_returntype()->is_void()) {
        f_service_ << indent() << "if result.success is not None:" << endl;
        if (gen_twisted_) {
          f_service_ << indent() << indent_str() << "return d.callback(result.success)" << endl;
        } else {
          f_service_ << indent() << indent_str() << "return result.success" << endl;
        }
      }

      t_struct* xs = (*f_iter)->get_xceptions();
      const std::vector<t_field*>& xceptions = xs->get_members();
      vector<t_field*>::const_iterator x_iter;
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        const string& xname = (*x_iter)->get_name();
        f_service_ << indent() << "if result." << xname << " is not None:" << endl;
        if (gen_twisted_) {
          f_service_ << indent() << indent_str() << "return d.errback(result." << xname << ")"
                     << endl;
        } else {
          f_service_ << indent() << indent_str() << "raise result." << xname << "" << endl;
        }
      }

      // Careful, only return _result if not a void function
      if ((*f_iter)->get_returntype()->is_void()) {
        if (gen_twisted_) {
          f_service_ << indent() << "return d.callback(None)" << endl;
        } else {
          f_service_ << indent() << "return" << endl;
        }
      } else {
        if (gen_twisted_) {
          f_service_
              << indent()
              << "return d.errback(TApplicationException(TApplicationException.MISSING_RESULT, \""
              << (*f_iter)->get_name() << " failed: unknown result\"))" << endl;
        } else {
          f_service_ << indent()
                     << "raise TApplicationException(TApplicationException.MISSING_RESULT, \""
                     << (*f_iter)->get_name() << " failed: unknown result\")" << endl;
        }
      }

      // Close function
      indent_down();
    }
  }

  indent_down();
}